

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_intersect.cpp
# Opt level: O0

int ON_Intersect(ON_Line *line,ON_Arc *arc,double *line_t0,ON_3dPoint *arc_point0,double *line_t1,
                ON_3dPoint *arc_point1)

{
  double dVar1;
  double dVar2;
  bool bVar3;
  double *pdVar4;
  long lVar5;
  ON_Interval OVar6;
  undefined1 local_198 [8];
  ON_3dPoint q;
  double dStack_178;
  double local_170;
  ON_3dPoint local_168;
  undefined1 local_150 [8];
  ON_Interval arc_domain;
  int local_12c;
  int local_128;
  int xcnt;
  int i;
  bool b [2];
  double s;
  double a [2];
  double t [2];
  ON_3dPoint p [2];
  undefined1 local_c0 [8];
  ON_Circle c;
  ON_3dPoint *arc_point1_local;
  double *line_t1_local;
  ON_3dPoint *arc_point0_local;
  double *line_t0_local;
  ON_Arc *arc_local;
  ON_Line *line_local;
  
  c.radius = (double)arc_point1;
  memcpy((ON_Circle *)local_c0,arc,0x88);
  xcnt._2_2_ = 0;
  local_12c = ON_Intersect(line,(ON_Circle *)local_c0,a + 1,(ON_3dPoint *)(t + 1),t,
                           (ON_3dPoint *)&p[0].z);
  if (0 < local_12c) {
    OVar6 = ON_Arc::DomainRadians(arc);
    arc_domain.m_t[0] = OVar6.m_t[1];
    local_150 = OVar6.m_t[0];
    for (local_128 = 0; local_128 < local_12c; local_128 = local_128 + 1) {
      bVar3 = ON_Circle::ClosestPointTo
                        ((ON_Circle *)local_c0,(ON_3dPoint *)&p[(long)local_128 + -1].z,
                         a + (long)local_128 + -1);
      *(bool *)((long)&xcnt + (long)local_128 + 2) = bVar3;
      if ((*(byte *)((long)&xcnt + (long)local_128 + 2) & 1) != 0) {
        _i = ON_Interval::NormalizedParameterAt((ON_Interval *)local_150,a[(long)local_128 + -1]);
        if (0.0 <= _i) {
          if (1.0 < _i) {
            if (1.0000000149011612 < _i) {
              *(undefined1 *)((long)&xcnt + (long)local_128 + 2) = 0;
            }
            else {
              pdVar4 = ON_Interval::operator[]((ON_Interval *)local_150,1);
              a[(long)local_128 + -1] = *pdVar4;
              ON_Circle::PointAt((ON_3dPoint *)&q.z,(ON_Circle *)local_c0,a[(long)local_128 + -1]);
              lVar5 = (long)local_128;
              p[lVar5].y = local_170;
              p[lVar5 + -1].z = q.z;
              p[lVar5].x = dStack_178;
              bVar3 = ON_Line::ClosestPointTo
                                (line,(ON_3dPoint *)&p[(long)local_128 + -1].z,
                                 a + (long)local_128 + 1);
              *(bool *)((long)&xcnt + (long)local_128 + 2) = bVar3;
            }
          }
        }
        else if (_i < -1.490116119385e-08) {
          *(undefined1 *)((long)&xcnt + (long)local_128 + 2) = 0;
        }
        else {
          pdVar4 = ON_Interval::operator[]((ON_Interval *)local_150,0);
          a[(long)local_128 + -1] = *pdVar4;
          ON_Circle::PointAt(&local_168,(ON_Circle *)local_c0,a[(long)local_128 + -1]);
          lVar5 = (long)local_128;
          p[lVar5].y = local_168.z;
          p[lVar5 + -1].z = local_168.x;
          p[lVar5].x = local_168.y;
          bVar3 = ON_Line::ClosestPointTo
                            (line,(ON_3dPoint *)&p[(long)local_128 + -1].z,a + (long)local_128 + 1);
          *(bool *)((long)&xcnt + (long)local_128 + 2) = bVar3;
        }
      }
    }
    if (((xcnt._2_2_ & 1) == 0) && ((xcnt._2_2_ & 0x100) == 0)) {
      local_12c = 0;
    }
    if (local_12c == 2) {
      if ((xcnt._2_2_ & 0x100) == 0) {
        local_12c = 1;
      }
      if ((xcnt._2_2_ & 1) == 0) {
        local_12c = 1;
        a[1] = t[0];
        t[1] = p[0].z;
        p[0].x = p[1].x;
        p[0].y = p[1].y;
        xcnt._2_2_ = (ushort)(xcnt._3_1_ & 1);
      }
      if (local_12c == 2) {
        if ((a[1] == t[0]) && (!NAN(a[1]) && !NAN(t[0]))) {
          local_12c = 1;
          xcnt._2_2_ = xcnt._2_2_ & 0xff;
          ON_Line::PointAt((ON_3dPoint *)local_198,line,a[1]);
          dVar1 = ON_3dPoint::DistanceTo((ON_3dPoint *)(t + 1),(ON_3dPoint *)local_198);
          dVar2 = ON_3dPoint::DistanceTo((ON_3dPoint *)&p[0].z,(ON_3dPoint *)local_198);
          if (dVar2 < dVar1) {
            a[1] = t[0];
            t[1] = p[0].z;
            p[0].x = p[1].x;
            p[0].y = p[1].y;
          }
        }
      }
    }
    if ((local_12c == 1) && ((xcnt._2_2_ & 1) == 0)) {
      local_12c = 0;
    }
    if (0 < local_12c) {
      if (line_t0 != (double *)0x0) {
        *line_t0 = a[1];
      }
      arc_point0->x = t[1];
      arc_point0->y = p[0].x;
      arc_point0->z = p[0].y;
    }
    if (local_12c == 2) {
      if (line_t1 != (double *)0x0) {
        *line_t1 = t[0];
      }
      *(double *)c.radius = p[0].z;
      *(double *)((long)c.radius + 8) = p[1].x;
      *(double *)((long)c.radius + 0x10) = p[1].y;
    }
  }
  ON_Circle::~ON_Circle((ON_Circle *)local_c0);
  return local_12c;
}

Assistant:

int ON_Intersect(
      const ON_Line& line, 
      const ON_Arc& arc,
      double* line_t0,
      ON_3dPoint& arc_point0,
      double* line_t1,
      ON_3dPoint& arc_point1
      )
{
  // RH-48633 In V7 and earlier there were cases where 1 was returned and the 
  // returned arc_point0 is the closest point on the arc to the line but not an
  // intersection point
  ON_Circle c = arc;
  ON_3dPoint p[2];
  double t[2], a[2], s;
  bool b[2] = {false,false};
  int i, xcnt = ON_Intersect( line, c, &t[0], p[0], &t[1], p[1] );
 
  if ( xcnt > 0 )
  {
    // make sure points are on the arc;
    ON_Interval arc_domain = arc.DomainRadians();
    for ( i = 0; i < xcnt; i++ )
    {
      b[i] = c.ClosestPointTo(p[i], &a[i]);
      if ( b[i] )
      {
        s = arc_domain.NormalizedParameterAt(a[i]);
        if ( s < 0.0 )
        {
          if ( s >= -ON_SQRT_EPSILON )
          {
            a[i] = arc_domain[0];
            p[i] = c.PointAt(a[i]);
            b[i] = line.ClosestPointTo( p[i], &t[i] );
          }
          else
            b[i] = false;
        }
        else if ( s > 1.0 )
        {
          if ( s <= 1.0+ON_SQRT_EPSILON )
          {
            a[i] = arc_domain[1];
            p[i] = c.PointAt(a[i]);
            b[i] = line.ClosestPointTo( p[i], &t[i] );
          }
          else
            b[i] = false;
        }
      }
    }
    if ( !b[0] && !b[1] )
      xcnt = 0;

    if ( xcnt == 2 )
    {
      if ( !b[1] )
        xcnt = 1;
      if ( !b[0] )
      {
        xcnt = 1;
        b[0] = b[1];
        t[0] = t[1];
        a[0] = a[1];
        p[0] = p[1];
        b[1] = 0;
      }
      if ( xcnt == 2 && t[0] == t[1] )
      {
        xcnt = 1;
        b[1] = 0;
        ON_3dPoint q = line.PointAt(t[0]);
        if ( p[0].DistanceTo(q) > p[1].DistanceTo(q) )
        {
          a[0] = a[1];
          t[0] = t[1];
          p[0] = p[1];
        }
      }
    }
    if  ( xcnt == 1 && !b[0] )
      xcnt = 0;
    if ( xcnt >= 1 )
    {
      if ( line_t0 )
        *line_t0 = t[0];
      arc_point0 = p[0];
    }
    if ( xcnt == 2 )
    {
      if ( line_t1 )
        *line_t1 = t[1];
      arc_point1 = p[1];
    }
  }
  return xcnt;
}